

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyPtr.h
# Opt level: O2

CopyPtr<slang::AssociativeArray> * __thiscall
slang::CopyPtr<slang::AssociativeArray>::operator=
          (CopyPtr<slang::AssociativeArray> *this,CopyPtr<slang::AssociativeArray> *other)

{
  AssociativeArray *pAVar1;
  
  if (this != other) {
    pAVar1 = this->ptr;
    if (pAVar1 != (AssociativeArray *)0x0) {
      AssociativeArray::~AssociativeArray(pAVar1);
    }
    operator_delete(pAVar1,0x58);
    pAVar1 = (AssociativeArray *)operator_new(0x58);
    AssociativeArray::AssociativeArray(pAVar1,other->ptr);
    this->ptr = pAVar1;
  }
  return this;
}

Assistant:

CopyPtr& operator=(const CopyPtr& other) {
        if (this != &other) {
            delete ptr;
            ptr = new T(*other.ptr);
        }
        return *this;
    }